

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPLinearClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPLinearClause *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OpenMPLinearClauseModifier OVar2;
  pointer pcVar3;
  int iVar4;
  string clause_string;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"linear ","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(","");
  OVar2 = this->modifier;
  if (OVar2 < OMPC_LINEAR_MODIFIER_user) {
    std::__cxx11::string::append((char *)&local_70);
  }
  if (1 < local_68) {
    std::__cxx11::string::append((char *)&local_70);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_50,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (OVar2 < OMPC_LINEAR_MODIFIER_user) {
    std::__cxx11::string::append((char *)&local_70);
  }
  pcVar3 = (this->user_defined_step)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (this->user_defined_step)._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    std::__cxx11::string::append((char *)&local_70);
    pcVar3 = (this->user_defined_step)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (this->user_defined_step)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPLinearClause::toString() {

    std::string result = "linear ";
    std::string clause_string = "(";
    bool flag = false;
    OpenMPLinearClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_LINEAR_MODIFIER_val:
            clause_string += "val";
            flag = true;
            break;
        case OMPC_LINEAR_MODIFIER_ref:
            clause_string += "ref";
            flag = true;
            break;
        case OMPC_LINEAR_MODIFIER_uval:
            clause_string += "uval";
            flag = true;
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += "( ";
    };
    clause_string += this->expressionToString();
    if (flag == true) {
        clause_string += ") ";
    };
    if(this->getUserDefinedStep() != ""){
        clause_string += ":";
        clause_string += this->getUserDefinedStep();
    }
    clause_string += ") ";
    result += clause_string;
    return result;
}